

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O2

double intra_rd_variance_factor(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bs)

{
  Block4x4VarInfo *pBVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  int iVar4;
  aom_variance_fn_t p_Var5;
  uint uVar6;
  int iVar7;
  int j;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  uint8_t *puVar12;
  int iVar13;
  double dVar14;
  undefined8 extraout_XMM0_Qb;
  double dVar15;
  double dVar16;
  undefined8 uVar17;
  double dVar18;
  undefined1 auVar19 [16];
  int local_78;
  uint local_68;
  uint sse;
  uint sse_1;
  double local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  dVar15 = (double)(cpi->oxcf).speed * -0.25 + 1.0;
  dVar14 = 1.0;
  if (0.0 < dVar15) {
    BVar2 = ((cpi->common).seq_params)->sb_size;
    bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar2];
    iVar7 = (x->e_mbd).mb_to_right_edge;
    iVar10 = (x->e_mbd).mb_to_bottom_edge;
    lVar9 = (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bs]
            * 4 - (ulong)(iVar7 >> 0x1f & (uint)-iVar7 >> 3);
    iVar7 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bs] *
            4 - (iVar10 >> 0x1f & (uint)-iVar10 >> 3);
    puVar12 = "";
    if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
      puVar12 = (uint8_t *)0x233128;
    }
    p_Var5 = cpi->ppi->fn_ptr[0].vf;
    iVar10 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar2] -
              1 & (x->e_mbd).mi_row) * (uint)bVar3 + (bVar3 - 1 & (x->e_mbd).mi_col);
    local_48._0_16_ = ZEXT816(0);
    for (iVar13 = 0; iVar13 < iVar7; iVar13 = iVar13 + 4) {
      iVar11 = iVar10;
      for (lVar8 = 0; lVar8 < lVar9; lVar8 = lVar8 + 4) {
        pBVar1 = x->src_var_info_of_4x4_sub_blocks + iVar11;
        uVar6 = x->src_var_info_of_4x4_sub_blocks[iVar11].var;
        if ((int)uVar6 < 0) {
          iVar4 = x->plane[0].src.stride;
          uVar6 = (*p_Var5)(x->plane[0].src.buf + lVar8 + iVar13 * iVar4,iVar4,puVar12,0,&sse);
          pBVar1->var = uVar6;
LAB_002211fb:
          dVar14 = log1p((double)(int)uVar6 * 0.0625);
          pBVar1->log_var = dVar14;
          uVar17 = extraout_XMM0_Qb;
        }
        else {
          dVar14 = pBVar1->log_var;
          uVar17 = 0;
          if (dVar14 < 0.0) goto LAB_002211fb;
        }
        iVar4 = (x->e_mbd).plane[0].dst.stride;
        local_58 = dVar14;
        uStack_50 = uVar17;
        uVar6 = (*p_Var5)((x->e_mbd).plane[0].dst.buf + lVar8 + iVar13 * iVar4,iVar4,puVar12,0,
                          &sse_1);
        dVar14 = log1p((double)(int)uVar6 * 0.0625);
        local_48._0_8_ = (double)local_48._0_8_ + local_58;
        local_48._8_8_ = (double)local_48._8_8_ + dVar14;
        iVar11 = iVar11 + 1;
      }
      local_68 = (uint)bVar3;
      iVar10 = iVar10 + local_68;
    }
    local_78 = (int)lVar9;
    dVar14 = (double)((iVar7 * local_78) / 0x10);
    auVar19._8_8_ = dVar14;
    auVar19._0_8_ = dVar14;
    auVar19 = divpd(local_48._0_16_,auVar19);
    dVar18 = auVar19._0_8_ + 1e-06;
    dVar14 = auVar19._8_8_ + 1e-06;
    if (dVar14 <= dVar18) {
      dVar16 = 1.0;
      if ((dVar14 < dVar15) && (dVar14 = dVar18 - dVar14, 0.5 < dVar14)) {
        dVar16 = (dVar14 + dVar14) / dVar18 + 1.0;
      }
    }
    else {
      dVar16 = 1.0;
      if ((dVar18 < dVar15) && (0.5 < dVar14 - dVar18)) {
        dVar16 = (dVar14 - dVar18) / (dVar18 + dVar18) + 1.0;
      }
    }
    dVar14 = 3.0;
    if (dVar16 <= 3.0) {
      dVar14 = dVar16;
    }
  }
  return dVar14;
}

Assistant:

static double intra_rd_variance_factor(const AV1_COMP *cpi, MACROBLOCK *x,
                                       BLOCK_SIZE bs) {
  double threshold = INTRA_RD_VAR_THRESH(cpi->oxcf.speed);
  // For non-positive threshold values, the comparison of source and
  // reconstructed variances with threshold evaluates to false
  // (src_var < threshold/rec_var < threshold) as these metrics are greater than
  // than 0. Hence further calculations are skipped.
  if (threshold <= 0) return 1.0;

  double variance_rd_factor = 1.0;
  double avg_log_src_variance = 0.0;
  double avg_log_recon_variance = 0.0;
  double var_diff = 0.0;

  compute_avg_log_variance(cpi, x, bs, &avg_log_src_variance,
                           &avg_log_recon_variance);

  // Dont allow 0 to prevent / 0 below.
  avg_log_src_variance += 0.000001;
  avg_log_recon_variance += 0.000001;

  if (avg_log_src_variance >= avg_log_recon_variance) {
    var_diff = (avg_log_src_variance - avg_log_recon_variance);
    if ((var_diff > 0.5) && (avg_log_recon_variance < threshold)) {
      variance_rd_factor = 1.0 + ((var_diff * 2) / avg_log_src_variance);
    }
  } else {
    var_diff = (avg_log_recon_variance - avg_log_src_variance);
    if ((var_diff > 0.5) && (avg_log_src_variance < threshold)) {
      variance_rd_factor = 1.0 + (var_diff / (2 * avg_log_src_variance));
    }
  }

  // Limit adjustment;
  variance_rd_factor = AOMMIN(3.0, variance_rd_factor);

  return variance_rd_factor;
}